

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

int __thiscall
unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
init(olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
    EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  write_guard *in_RCX;
  optimistic_lock *in_RDX;
  undefined8 *in_R8;
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  local_48;
  
  if (in_RCX->lock != in_RDX) {
    __assert_fail("source_node_guard.guards(lock(source_node))",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x494,
                  "void unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>::init(db_type &, inode_4_type &, unodb::optimistic_lock::write_guard &, olc_db_leaf_unique_ptr_type &&, tree_depth_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  obsolete<unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             in_RDX,in_RCX);
  local_48._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  ._M_head_impl.db =
       (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        )*in_R8;
  local_48._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)in_R8[1];
  in_R8[1] = 0;
  basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ::init(&this->super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>,ctx);
  std::
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr(&local_48);
  if (in_RCX->lock == (optimistic_lock *)0x0) {
    return extraout_EAX;
  }
  __assert_fail("!source_node_guard.active()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x497,
                "void unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>::init(db_type &, inode_4_type &, unodb::optimistic_lock::write_guard &, olc_db_leaf_unique_ptr_type &&, tree_depth_type) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void init(db_type& db_instance, inode_4_type& source_node,
            unodb::optimistic_lock::write_guard& source_node_guard,
            olc_db_leaf_unique_ptr_type&& child,
            tree_depth_type depth) noexcept {
    UNODB_DETAIL_ASSERT(source_node_guard.guards(lock(source_node)));
    parent_class::init(db_instance, obsolete(source_node, source_node_guard),
                       std::move(child), depth);
    UNODB_DETAIL_ASSERT(!source_node_guard.active());
  }